

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O0

void Cmd_openmenu(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *text;
  FName local_20;
  int local_1c;
  APlayerPawn *pAStack_18;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  local_1c = key;
  pAStack_18 = who;
  who_local = (APlayerPawn *)argv;
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 2) {
    Printf("Usage: openmenu \"menu_name\"");
  }
  else {
    M_StartControlPanel(true);
    text = FCommandLine::operator[]((FCommandLine *)who_local,1);
    FName::FName(&local_20,text);
    M_SetMenu(&local_20,-1);
  }
  return;
}

Assistant:

CCMD (openmenu)
{
	if (argv.argc() < 2)
	{
		Printf("Usage: openmenu \"menu_name\"");
		return;
	}
	M_StartControlPanel (true);
	M_SetMenu(argv[1], -1);
}